

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

void nn_sock_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_sock *local_38;
  nn_ep *ep;
  nn_sock *sock;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_38 = (nn_sock *)self;
  if (self == (nn_fsm *)0x0) {
    local_38 = (nn_sock *)0x0;
  }
  iVar1 = local_38->state;
  if (iVar1 == 1) {
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
              ,0x3df);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == -2) {
      local_38->state = 2;
    }
    else {
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,0xfffffffe,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x3db);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sock_action_zombify(local_38);
    }
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x416);
        fflush(_stderr);
        nn_err_abort();
      }
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
              ,0x41c);
      fflush(_stderr);
      nn_err_abort();
    }
    if (src == -2) {
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,0xfffffffe,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x3ee);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sock_action_zombify(local_38);
    }
    else if (src == 1) {
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x3fe);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_list_erase(&local_38->sdeps,(nn_list_item *)((long)srcptr + 0x80));
      nn_ep_term((nn_ep *)srcptr);
      nn_free(srcptr);
    }
    else if (type == 0x84c3) {
      (*local_38->sockbase->vfptr->in)(local_38->sockbase,(nn_pipe *)srcptr);
    }
    else {
      if (type != 0x84c4) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x40e);
        fflush(_stderr);
        nn_err_abort();
      }
      (*local_38->sockbase->vfptr->out)(local_38->sockbase,(nn_pipe *)srcptr);
    }
  }
  return;
}

Assistant:

static void nn_sock_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    switch (sock->state) {

/******************************************************************************/
/*  INIT state.                                                               */
/******************************************************************************/
    case NN_SOCK_STATE_INIT:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sock->state = NN_SOCK_STATE_ACTIVE;
                return;
            case NN_SOCK_ACTION_ZOMBIFY:
                nn_sock_action_zombify (sock);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:
            nn_fsm_bad_source (sock->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SOCK_ACTION_ZOMBIFY:
                nn_sock_action_zombify (sock);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        case NN_SOCK_SRC_EP:
            switch (type) {
            case NN_EP_STOPPED:

                /*  This happens when an endpoint is closed using
                    nn_shutdown() function. */
                ep = (struct nn_ep*) srcptr;
                nn_list_erase (&sock->sdeps, &ep->item);
                nn_ep_term (ep);
                nn_free (ep);
                return;

            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:

            /*  The assumption is that all the other events come from pipes. */
            switch (type) {
            case NN_PIPE_IN:
                sock->sockbase->vfptr->in (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            case NN_PIPE_OUT:
                sock->sockbase->vfptr->out (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }
        }

/******************************************************************************/
/*  ZOMBIE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ZOMBIE:
        nn_fsm_bad_state (sock->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sock->state, src, type);
    }
}